

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O2

Float __thiscall pbrt::BilinearPatch::PDF(BilinearPatch *this,ShapeSampleContext *ctx,Vector3f *wi)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  bool bVar6;
  int iVar7;
  ShapeIntersection *pSVar8;
  long lVar9;
  Normal3f *n;
  Point3<float> *this_00;
  Point3<float> *this_01;
  Point3<float> *this_02;
  Point3<float> *this_03;
  long in_FS_OFFSET;
  Float FVar10;
  type tVar11;
  float fVar12;
  Point2f p;
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 extraout_var_03 [56];
  undefined1 auVar41 [64];
  undefined1 extraout_var_04 [56];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  Point3f PVar45;
  Vector3<float> VVar46;
  initializer_list<float> v;
  span<const_float> w_00;
  Tuple3<pbrt::Point3,_float> local_268;
  undefined4 local_25c;
  undefined1 local_258 [16];
  long local_248;
  Tuple3<pbrt::Point3,_float> local_240;
  array<float,_4> w;
  Tuple3<pbrt::Vector3,_float> local_220;
  Tuple3<pbrt::Vector3,_float> local_210;
  Tuple3<pbrt::Vector3,_float> local_200;
  Tuple3<pbrt::Vector3,_float> local_1f0;
  Tuple3<pbrt::Vector3,_float> local_1e0;
  Tuple3<pbrt::Vector3,_float> local_1d0;
  Tuple3<pbrt::Vector3,_float> local_1c0;
  Tuple3<pbrt::Vector3,_float> local_1b0;
  Tuple3<pbrt::Vector3,_float> local_1a0;
  Tuple3<pbrt::Vector3,_float> local_190;
  Tuple3<pbrt::Vector3,_float> local_180;
  Tuple3<pbrt::Vector3,_float> local_170;
  optional<pbrt::ShapeIntersection> isect;
  Ray ray;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 auVar44 [56];
  
  local_258._8_8_ = local_258._0_8_;
  local_258._0_8_ = wi;
  ShapeSampleContext::SpawnRay(&ray,ctx,wi);
  auVar44 = (undefined1  [56])0x0;
  Intersect(&isect,this,&ray,INFINITY);
  if ((PDF(pbrt::ShapeSampleContext_const&,pbrt::Vector3<float>const&)::reg == '\0') &&
     (iVar7 = __cxa_guard_acquire(&PDF(pbrt::ShapeSampleContext_const&,pbrt::Vector3<float>const&)::
                                   reg), auVar44 = extraout_var_05, iVar7 != 0)) {
    StatRegisterer::StatRegisterer
              ((StatRegisterer *)
               &PDF(pbrt::ShapeSampleContext_const&,pbrt::Vector3<float>const&)::reg,
               PDF(pbrt::ShapeSampleContext_const&,pbrt::Vector3<float>const&)::StatsAccumulator__,
               (PixelAccumFunc)0x0);
    __cxa_guard_release(&PDF(pbrt::ShapeSampleContext_const&,pbrt::Vector3<float>const&)::reg);
    auVar44 = extraout_var_06;
  }
  *(long *)(in_FS_OFFSET + -0x468) = *(long *)(in_FS_OFFSET + -0x468) + 1;
  if (isect.set == false) {
    *(long *)(in_FS_OFFSET + -0x470) = *(long *)(in_FS_OFFSET + -0x470) + 1;
    local_258 = ZEXT816(0);
  }
  else {
    lVar3 = *(long *)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
    lVar4 = *(long *)(lVar3 + 0x10);
    lVar9 = (long)this->blpIndex * 0x10;
    lVar3 = *(long *)(lVar3 + 0x18);
    local_248 = (long)*(int *)(lVar4 + 0xc + lVar9);
    iVar7 = *(int *)(lVar4 + lVar9);
    iVar1 = *(int *)(lVar4 + 4 + lVar9);
    iVar2 = *(int *)(lVar4 + 8 + lVar9);
    PVar45 = ShapeSampleContext::p(ctx);
    local_268.z = PVar45.super_Tuple3<pbrt::Point3,_float>.z;
    auVar13._0_8_ = PVar45.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar13._8_56_ = auVar44;
    local_268._0_8_ = vmovlps_avx(auVar13._0_16_);
    this_00 = (Point3<float> *)((long)iVar7 * 0xc + lVar3);
    VVar46 = Point3<float>::operator-(this_00,(Point3<float> *)&local_268);
    w.values[2] = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar14._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar14._8_56_ = auVar44;
    w.values._0_8_ = vmovlps_avx(auVar14._0_16_);
    VVar46 = Normalize<float>((Vector3<float> *)&w);
    local_1e0.z = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar15._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar15._8_56_ = auVar44;
    local_1e0._0_8_ = vmovlps_avx(auVar15._0_16_);
    PVar45 = ShapeSampleContext::p(ctx);
    local_268.z = PVar45.super_Tuple3<pbrt::Point3,_float>.z;
    auVar16._0_8_ = PVar45.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar16._8_56_ = auVar44;
    local_268._0_8_ = vmovlps_avx(auVar16._0_16_);
    this_01 = (Point3<float> *)((long)iVar1 * 0xc + lVar3);
    VVar46 = Point3<float>::operator-(this_01,(Point3<float> *)&local_268);
    w.values[2] = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar17._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar17._8_56_ = auVar44;
    w.values._0_8_ = vmovlps_avx(auVar17._0_16_);
    VVar46 = Normalize<float>((Vector3<float> *)&w);
    local_1f0.z = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar18._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar18._8_56_ = auVar44;
    local_1f0._0_8_ = vmovlps_avx(auVar18._0_16_);
    PVar45 = ShapeSampleContext::p(ctx);
    local_268.z = PVar45.super_Tuple3<pbrt::Point3,_float>.z;
    auVar19._0_8_ = PVar45.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar19._8_56_ = auVar44;
    local_268._0_8_ = vmovlps_avx(auVar19._0_16_);
    this_02 = (Point3<float> *)((long)iVar2 * 0xc + lVar3);
    VVar46 = Point3<float>::operator-(this_02,(Point3<float> *)&local_268);
    w.values[2] = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar20._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar20._8_56_ = auVar44;
    w.values._0_8_ = vmovlps_avx(auVar20._0_16_);
    VVar46 = Normalize<float>((Vector3<float> *)&w);
    local_200.z = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar21._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar21._8_56_ = auVar44;
    local_200._0_8_ = vmovlps_avx(auVar21._0_16_);
    PVar45 = ShapeSampleContext::p(ctx);
    local_268.z = PVar45.super_Tuple3<pbrt::Point3,_float>.z;
    auVar22._0_8_ = PVar45.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar22._8_56_ = auVar44;
    local_268._0_8_ = vmovlps_avx(auVar22._0_16_);
    this_03 = (Point3<float> *)(lVar3 + local_248 * 0xc);
    VVar46 = Point3<float>::operator-(this_03,(Point3<float> *)&local_268);
    w.values[2] = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar23._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar23._8_56_ = auVar44;
    w.values._0_8_ = vmovlps_avx(auVar23._0_16_);
    VVar46 = Normalize<float>((Vector3<float> *)&w);
    local_210.z = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar24._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar24._8_56_ = auVar44;
    local_210._0_8_ = vmovlps_avx(auVar24._0_16_);
    bVar6 = IsRectangle(this);
    if (((!bVar6) ||
        (*(long *)(*(long *)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8) + 0x38) != 0)) ||
       (FVar10 = SphericalQuadArea((Vector3f *)&local_1e0,(Vector3f *)&local_1f0,
                                   (Vector3f *)&local_210,(Vector3f *)&local_200), FVar10 <= 0.0001)
       ) {
      pSVar8 = pstd::optional<pbrt::ShapeIntersection>::value(&isect);
      FVar10 = PDF(this,(Interaction *)pSVar8);
      local_248 = CONCAT44(local_248._4_4_,FVar10);
      auVar44 = extraout_var_03;
      pSVar8 = pstd::optional<pbrt::ShapeIntersection>::value(&isect);
      VVar46 = Tuple3<pbrt::Vector3,_float>::operator-
                         ((Tuple3<pbrt::Vector3,_float> *)local_258._0_8_);
      w.values[2] = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar41._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar41._8_56_ = auVar44;
      w.values._0_8_ = vmovlps_avx(auVar41._0_16_);
      tVar11 = AbsDot<float>(&(pSVar8->intr).super_Interaction.n,(Vector3<float> *)&w);
      local_258._0_4_ = tVar11;
      auVar44 = extraout_var_04;
      PVar45 = ShapeSampleContext::p(ctx);
      local_268.z = PVar45.super_Tuple3<pbrt::Point3,_float>.z;
      auVar42._0_8_ = PVar45.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar42._8_56_ = auVar44;
      local_268._0_8_ = vmovlps_avx(auVar42._0_16_);
      pSVar8 = pstd::optional<pbrt::ShapeIntersection>::value(&isect);
      PVar45 = Interaction::p((Interaction *)pSVar8);
      local_240.z = PVar45.super_Tuple3<pbrt::Point3,_float>.z;
      auVar43._0_8_ = PVar45.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar43._8_56_ = auVar44;
      local_240._0_8_ = vmovlps_avx(auVar43._0_16_);
      fVar12 = DistanceSquared<float>((Point3<float> *)&local_268,(Point3<float> *)&local_240);
      fVar12 = (float)local_248 / ((float)local_258._0_4_ / fVar12);
      local_258._4_12_ = SUB6012((undefined1  [60])0x0,0);
      local_258._0_4_ = (uint)(ABS(fVar12) != INFINITY) * (int)fVar12;
    }
    else {
      FVar10 = SphericalQuadArea((Vector3f *)&local_1e0,(Vector3f *)&local_1f0,
                                 (Vector3f *)&local_210,(Vector3f *)&local_200);
      local_258 = ZEXT416((uint)(1.0 / FVar10));
      auVar44 = ZEXT456(0);
      if (((ctx->ns).super_Tuple3<pbrt::Normal3,_float>.x == 0.0) &&
         ((ctx->ns).super_Tuple3<pbrt::Normal3,_float>.y == 0.0)) {
        fVar12 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.z;
        auVar44 = (undefined1  [56])0x0;
        if ((fVar12 == 0.0) && (!NAN(fVar12))) goto LAB_0040b114;
      }
      PVar45 = ShapeSampleContext::p(ctx);
      local_240.z = PVar45.super_Tuple3<pbrt::Point3,_float>.z;
      auVar25._0_8_ = PVar45.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar25._8_56_ = auVar44;
      local_240._0_8_ = vmovlps_avx(auVar25._0_16_);
      VVar46 = Point3<float>::operator-(this_00,(Point3<float> *)&local_240);
      local_1d0.z = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar26._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar26._8_56_ = auVar44;
      local_1d0._0_8_ = vmovlps_avx(auVar26._0_16_);
      VVar46 = Normalize<float>((Vector3<float> *)&local_1d0);
      local_220.z = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar27._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar27._8_56_ = auVar44;
      n = &ctx->ns;
      local_220._0_8_ = vmovlps_avx(auVar27._0_16_);
      auVar28._0_4_ = AbsDot<float>((Vector3<float> *)&local_220,n);
      auVar28._4_60_ = extraout_var;
      auVar5 = vmaxss_avx(auVar28._0_16_,ZEXT416(0x3c23d70a));
      auVar44 = ZEXT856(auVar5._8_8_);
      local_268.x = auVar5._0_4_;
      VVar46 = Point3<float>::operator-(this_01,(Point3<float> *)&local_240);
      local_180.z = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar29._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar29._8_56_ = auVar44;
      local_180._0_8_ = vmovlps_avx(auVar29._0_16_);
      VVar46 = Normalize<float>((Vector3<float> *)&local_180);
      local_170.z = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar30._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar30._8_56_ = auVar44;
      local_170._0_8_ = vmovlps_avx(auVar30._0_16_);
      auVar31._0_4_ = AbsDot<float>((Vector3<float> *)&local_170,n);
      auVar31._4_60_ = extraout_var_00;
      auVar5 = vmaxss_avx(auVar31._0_16_,ZEXT416(0x3c23d70a));
      auVar44 = ZEXT856(auVar5._8_8_);
      local_268.y = auVar5._0_4_;
      VVar46 = Point3<float>::operator-(this_02,(Point3<float> *)&local_240);
      local_1a0.z = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar32._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar32._8_56_ = auVar44;
      local_1a0._0_8_ = vmovlps_avx(auVar32._0_16_);
      VVar46 = Normalize<float>((Vector3<float> *)&local_1a0);
      local_190.z = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar33._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar33._8_56_ = auVar44;
      local_190._0_8_ = vmovlps_avx(auVar33._0_16_);
      auVar34._0_4_ = AbsDot<float>((Vector3<float> *)&local_190,n);
      auVar34._4_60_ = extraout_var_01;
      auVar5 = vmaxss_avx(auVar34._0_16_,ZEXT416(0x3c23d70a));
      auVar44 = ZEXT856(auVar5._8_8_);
      local_268.z = auVar5._0_4_;
      VVar46 = Point3<float>::operator-(this_03,(Point3<float> *)&local_240);
      local_1c0.z = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar35._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar35._8_56_ = auVar44;
      local_1c0._0_8_ = vmovlps_avx(auVar35._0_16_);
      VVar46 = Normalize<float>((Vector3<float> *)&local_1c0);
      local_1b0.z = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar36._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar36._8_56_ = auVar44;
      local_1b0._0_8_ = vmovlps_avx(auVar36._0_16_);
      auVar37._0_4_ = AbsDot<float>((Vector3<float> *)&local_1b0,n);
      auVar37._4_60_ = extraout_var_02;
      auVar5 = vmaxss_avx(auVar37._0_16_,ZEXT416(0x3c23d70a));
      auVar44 = ZEXT856(auVar5._8_8_);
      local_25c = auVar5._0_4_;
      v._M_len = 4;
      v._M_array = &local_268.x;
      pstd::array<float,_4>::array(&w,v);
      VVar46 = Point3<float>::operator-(this_01,this_00);
      local_268.z = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar38._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar38._8_56_ = auVar44;
      local_268._0_8_ = vmovlps_avx(auVar38._0_16_);
      VVar46 = Point3<float>::operator-(this_02,this_00);
      local_220.z = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar39._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar39._8_56_ = auVar44;
      local_220._0_8_ = vmovlps_avx(auVar39._0_16_);
      pSVar8 = pstd::optional<pbrt::ShapeIntersection>::value(&isect);
      PVar45 = Interaction::p((Interaction *)pSVar8);
      local_1d0.z = PVar45.super_Tuple3<pbrt::Point3,_float>.z;
      auVar40._0_8_ = PVar45.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar40._8_56_ = auVar44;
      local_1d0._0_8_ = vmovlps_avx(auVar40._0_16_);
      p = InvertSphericalRectangleSample
                    ((Point3f *)&local_240,this_00,(Vector3f *)&local_268,(Vector3f *)&local_220,
                     (Point3f *)&local_1d0);
      w_00.n = 4;
      w_00.ptr = w.values;
      FVar10 = BilinearPDF(p,w_00);
      local_258 = ZEXT416((uint)((float)local_258._0_4_ * FVar10));
    }
  }
LAB_0040b114:
  pstd::optional<pbrt::ShapeIntersection>::~optional(&isect);
  return (Float)local_258._0_4_;
}

Assistant:

Float BilinearPatch::PDF(const ShapeSampleContext &ctx, const Vector3f &wi) const {
    // Intersect sample ray with shape geometry
    Ray ray = ctx.SpawnRay(wi);
    pstd::optional<ShapeIntersection> isect = Intersect(ray);
    CHECK_RARE(1e-6, !isect.has_value());
    if (!isect)
        return 0;

    // Get bilinear patch vertices in _p00_, _p01_, _p10_, and _p11_
    const BilinearPatchMesh *mesh = GetMesh();
    const int *v = &mesh->vertexIndices[4 * blpIndex];
    const Point3f &p00 = mesh->p[v[0]], &p10 = mesh->p[v[1]];
    const Point3f &p01 = mesh->p[v[2]], &p11 = mesh->p[v[3]];

    // Find normalized vectors to corners of bilinear patch
    Vector3f v00 = Normalize(p00 - ctx.p()), v10 = Normalize(p10 - ctx.p());
    Vector3f v01 = Normalize(p01 - ctx.p()), v11 = Normalize(p11 - ctx.p());

    if (IsRectangle() && !GetMesh()->imageDistribution &&
        SphericalQuadArea(v00, v10, v11, v01) > MinSphericalSampleArea) {
        // Return PDF for sample in spherical rectangle
        Float pdf = 1 / SphericalQuadArea(v00, v10, v11, v01);
        if (ctx.ns != Normal3f(0, 0, 0)) {
            // Compute $\cos \theta$ weights for rectangle seen from _ctx.p()_
            Point3f rp = ctx.p();
            pstd::array<Float, 4> w = pstd::array<Float, 4>{
                std::max<Float>(0.01, AbsDot(Normalize(p00 - rp), ctx.ns)),
                std::max<Float>(0.01, AbsDot(Normalize(p10 - rp), ctx.ns)),
                std::max<Float>(0.01, AbsDot(Normalize(p01 - rp), ctx.ns)),
                std::max<Float>(0.01, AbsDot(Normalize(p11 - rp), ctx.ns))};

            Point2f u = InvertSphericalRectangleSample(rp, p00, p10 - p00, p01 - p00,
                                                       isect->intr.p());
            return BilinearPDF(u, w) * pdf;
        } else
            return pdf;

    } else {
        // Return solid angle PDF for sampling bilinear patch at _intr_
        Float pdf = PDF(isect->intr) / (AbsDot(isect->intr.n, -wi) /
                                        DistanceSquared(ctx.p(), isect->intr.p()));
        if (IsInf(pdf))
            pdf = 0;
        return pdf;
    }
}